

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O2

bool __thiscall duckdb::InFilter::Equals(InFilter *this,TableFilter *other_p)

{
  bool bVar1;
  InFilter *pIVar2;
  
  if ((this->super_TableFilter).filter_type == other_p->filter_type) {
    pIVar2 = TableFilter::Cast<duckdb::InFilter>(other_p);
    bVar1 = ::std::operator==(&(pIVar2->values).
                               super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
                              &(this->values).
                               super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    return bVar1;
  }
  return false;
}

Assistant:

virtual bool Equals(const TableFilter &other) const {
		return filter_type == other.filter_type;
	}